

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_root.h
# Opt level: O2

void __thiscall
fructose::test_root::test_assert
          (test_root *this,bool condition,string *test_case_name,char *msg,char *filename,
          int line_number)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  
  this->m_assertion_tested = true;
  if (this->m_reverse_mode == condition) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: ");
    poVar2 = std::operator<<(poVar2,(string *)test_case_name);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,filename);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,line_number);
    poVar2 = std::operator<<(poVar2,"): ");
    poVar2 = std::operator<<(poVar2,msg);
    poVar2 = std::operator<<(poVar2," failed.");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = this->m_error_count;
    this->m_error_count = iVar1 + 1;
    if (this->m_stop_on_failure == true) {
      if (-1 < iVar1) {
        this->m_error_count = iVar1;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"test assertion failed");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void set_assertion_tested()
    {
        m_assertion_tested = true;
    }